

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_fixture.c
# Opt level: O0

void kbd_callback(char *name,int name_len,char *instruct,int instruct_len,int num_prompts,
                 LIBSSH2_USERAUTH_KBDINT_PROMPT *prompts,LIBSSH2_USERAUTH_KBDINT_RESPONSE *responses
                 ,void **abstract)

{
  char *pcVar1;
  size_t sVar2;
  uint local_34;
  int i;
  LIBSSH2_USERAUTH_KBDINT_PROMPT *prompts_local;
  int num_prompts_local;
  int instruct_len_local;
  char *instruct_local;
  int name_len_local;
  char *name_local;
  
  fprintf(_stdout,"Kb-int name: %.*s\n",(ulong)(uint)name_len,name);
  fprintf(_stdout,"Kb-int instruction: %.*s\n",(ulong)(uint)instruct_len,instruct);
  for (local_34 = 0; (int)local_34 < num_prompts; local_34 = local_34 + 1) {
    fprintf(_stdout,"Kb-int prompt %d: %.*s\n",(ulong)local_34,
            prompts[(int)local_34].length & 0xffffffff,prompts[(int)local_34].text);
  }
  if (num_prompts == 1) {
    pcVar1 = strdup(kbd_password);
    responses->text = pcVar1;
    sVar2 = strlen(kbd_password);
    responses->length = (uint)sVar2;
  }
  return;
}

Assistant:

static void kbd_callback(const char *name, int name_len,
                         const char *instruct, int instruct_len,
                         int num_prompts,
                         const LIBSSH2_USERAUTH_KBDINT_PROMPT *prompts,
                         LIBSSH2_USERAUTH_KBDINT_RESPONSE *responses,
                         void **abstract)
{
    int i;
    (void)abstract;

    fprintf(stdout, "Kb-int name: %.*s\n", name_len, name);
    fprintf(stdout, "Kb-int instruction: %.*s\n", instruct_len, instruct);
    for(i = 0; i < num_prompts; ++i) {
        fprintf(stdout, "Kb-int prompt %d: %.*s\n", i,
                (int)prompts[i].length, prompts[i].text);
    }

    if(num_prompts == 1) {
        responses[0].text = strdup(kbd_password);
        responses[0].length = (unsigned int)strlen(kbd_password);
    }
}